

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall Rml::Element::ScrollIntoView(Element *this,ScrollIntoViewOptions options)

{
  Box *this_00;
  Vector2f VVar1;
  Vector2f VVar2;
  ulong uVar3;
  Vector2f VVar4;
  Vector2f VVar5;
  Vector2f VVar6;
  Vector2f VVar7;
  ulong uVar8;
  Element *this_01;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_d8;
  ulong local_c0;
  float local_b8;
  float fStack_b4;
  float local_a8;
  float fStack_a4;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float local_48;
  
  local_c0 = options._8_8_;
  VVar4 = Box::GetSize(&this->main_box,Border);
  this_01 = this->parent;
  if (this_01 != (Element *)0x0) {
    uVar8 = local_c0 & 0xffffffff00000000;
    do {
      uVar3 = *(ulong *)&(this_01->meta->computed_values).common;
      fVar13 = (this_01->scrollable_overflow_rectangle).x;
      this_00 = &this_01->main_box;
      VVar5 = Box::GetSize(this_00,Padding);
      fVar10 = ElementScroll::GetScrollbarSize(&this_01->meta->scroll,VERTICAL);
      local_d8 = VVar5.x;
      if (fVar13 <= local_d8 - fVar10) {
        fVar13 = local_d8 - fVar10;
      }
      fVar10 = (this_01->scrollable_overflow_rectangle).y;
      VVar5 = Box::GetSize(this_00,Padding);
      fVar11 = ElementScroll::GetScrollbarSize(&this_01->meta->scroll,HORIZONTAL);
      fVar11 = VVar5.y - fVar11;
      if (fVar10 <= fVar11) {
        fVar10 = fVar11;
      }
      VVar5 = Box::GetSize(this_00,Padding);
      fVar11 = ElementScroll::GetScrollbarSize(&this_01->meta->scroll,VERTICAL);
      local_d8 = VVar5.x;
      VVar5 = Box::GetSize(this_00,Padding);
      fVar12 = ElementScroll::GetScrollbarSize(&this_01->meta->scroll,HORIZONTAL);
      fVar12 = VVar5.y - fVar12;
      uVar9 = (uint)uVar3;
      if ((((byte)(uVar3 >> 0xb) & local_d8 - fVar11 < fVar13) != 0) ||
         (((byte)(uVar3 >> 0xd) & fVar12 < fVar10) != 0)) {
        UpdateAbsoluteOffsetAndRenderBoxData(this_01);
        VVar5 = this_01->absolute_offset;
        UpdateAbsoluteOffsetAndRenderBoxData(this);
        VVar1 = this->absolute_offset;
        VVar2 = this_01->scroll_offset;
        VVar6 = Box::GetPosition(this_00,Padding);
        VVar7 = Box::GetPosition(this_00,Padding);
        fVar13 = 0.0;
        if ((uVar9 >> 0xb & 1) != 0) {
          local_b8 = VVar5.x;
          local_58 = VVar1.x;
          local_48 = VVar6.x;
          local_48 = local_48 - (local_b8 - local_58);
          local_68 = VVar4.x;
          fVar13 = GetScrollOffsetDelta
                             (options.horizontal,local_48,
                              (local_68 + local_48) - (local_d8 - fVar11));
        }
        fVar10 = 0.0;
        if ((uVar9 >> 0xd & 1) != 0) {
          fStack_b4 = VVar5.y;
          fStack_54 = VVar1.y;
          fVar10 = VVar7.y - (fStack_b4 - fStack_54);
          fStack_64 = VVar4.y;
          fVar10 = GetScrollOffsetDelta(options.vertical,fVar10,(fStack_64 + fVar10) - fVar12);
        }
        local_a8 = VVar2.x;
        fStack_a4 = VVar2.y;
        VVar5.y = fStack_a4 + fVar10;
        VVar5.x = local_a8 + fVar13;
        ScrollTo(this_01,VVar5,(ScrollBehavior)local_c0);
        local_c0 = 2;
      }
      if ((uVar9 >> 0xb & 1) == 0) {
        if (((byte)(uVar9 >> 0xd) & uVar8 == 0x100000000) != 0) {
          return;
        }
      }
      else if (uVar8 == 0x100000000) {
        return;
      }
      this_01 = this_01->parent;
    } while (this_01 != (Element *)0x0);
  }
  return;
}

Assistant:

void Element::ScrollIntoView(const ScrollIntoViewOptions options)
{
	const Vector2f size = main_box.GetSize(BoxArea::Border);
	ScrollBehavior scroll_behavior = options.behavior;

	for (Element* scroll_parent = parent; scroll_parent; scroll_parent = scroll_parent->GetParentNode())
	{
		using Style::Overflow;
		const ComputedValues& computed = scroll_parent->GetComputedValues();
		const bool scrollable_box_x = (computed.overflow_x() != Overflow::Visible && computed.overflow_x() != Overflow::Hidden);
		const bool scrollable_box_y = (computed.overflow_y() != Overflow::Visible && computed.overflow_y() != Overflow::Hidden);

		const Vector2f parent_scroll_size = {scroll_parent->GetScrollWidth(), scroll_parent->GetScrollHeight()};
		const Vector2f parent_client_size = {scroll_parent->GetClientWidth(), scroll_parent->GetClientHeight()};

		if ((scrollable_box_x && parent_scroll_size.x > parent_client_size.x) || (scrollable_box_y && parent_scroll_size.y > parent_client_size.y))
		{
			const Vector2f relative_offset = scroll_parent->GetAbsoluteOffset(BoxArea::Border) - GetAbsoluteOffset(BoxArea::Border);

			const Vector2f old_scroll_offset = {scroll_parent->GetScrollLeft(), scroll_parent->GetScrollTop()};
			const Vector2f parent_client_offset = {scroll_parent->GetClientLeft(), scroll_parent->GetClientTop()};

			const Vector2f delta_scroll_offset_start = parent_client_offset - relative_offset;
			const Vector2f delta_scroll_offset_end = delta_scroll_offset_start + size - parent_client_size;

			Vector2f scroll_delta = {
				scrollable_box_x ? GetScrollOffsetDelta(options.horizontal, delta_scroll_offset_start.x, delta_scroll_offset_end.x) : 0.f,
				scrollable_box_y ? GetScrollOffsetDelta(options.vertical, delta_scroll_offset_start.y, delta_scroll_offset_end.y) : 0.f,
			};

			scroll_parent->ScrollTo(old_scroll_offset + scroll_delta, scroll_behavior);

			// Currently, only a single scrollable parent can be smooth scrolled at a time, so any other parents must be instant scrolled.
			scroll_behavior = ScrollBehavior::Instant;
		}

		if ((scrollable_box_x || scrollable_box_y) && options.parentage == ScrollParentage::Closest)
			break;
	}
}